

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int ffexts(char *extspec,int *extnum,char *extname,int *extvers,int *hdutype,char *imagecolname,
          char *rowexpress,int *status)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ushort **ppuVar4;
  int *piVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  char *pcVar11;
  char *pcVar12;
  char tmpname [71];
  char *local_98;
  long local_90;
  int *local_88;
  char *local_80;
  short local_78;
  undefined6 uStack_76;
  
  *extnum = 0;
  *extname = '\0';
  *extvers = 0;
  *hdutype = -1;
  *imagecolname = '\0';
  *rowexpress = '\0';
  if (0 < *status) {
    return *status;
  }
  pcVar12 = extspec + -1;
  do {
    cVar1 = pcVar12[1];
    pcVar12 = pcVar12 + 1;
  } while ((long)cVar1 == 0x20);
  local_88 = hdutype;
  local_80 = imagecolname;
  ppuVar4 = __ctype_b_loc();
  bVar2 = true;
  if ((*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 8) == 0) {
LAB_00127b85:
    pcVar11 = pcVar12;
    if (bVar2) {
      sVar7 = strcspn(pcVar12,",:;");
      iVar10 = (int)sVar7;
      if (0x46 < iVar10) goto LAB_00127e20;
      strncat(extname,pcVar12,(long)iVar10);
      if (0 < iVar10) {
        do {
          iVar10 = (int)sVar7;
          if (extname[(sVar7 & 0xffffffff) - 1] != ' ') goto LAB_00127bd4;
          extname[(sVar7 & 0xffffffff) - 1] = '\0';
          sVar7 = (size_t)(iVar10 - 1);
        } while (1 < iVar10);
        iVar10 = 0;
      }
LAB_00127bd4:
      sVar7 = strspn(pcVar12 + iVar10," ,:");
      local_90 = (long)(int)sVar7;
      pcVar11 = pcVar12 + iVar10 + local_90;
      sVar7 = strcspn(pcVar11," ,:;");
      if ((int)sVar7 == 0) {
        strcpy((char *)&local_78,extname);
        ffupch((char *)&local_78);
        if ((CONCAT62(uStack_76,local_78) == 0x5952414d495250) || (local_78 == 0x50)) {
          *extname = '\0';
        }
      }
      else {
        iVar3 = __isoc99_sscanf(pcVar11,"%d",extvers);
        if (iVar3 != 1) {
          ffpmsg("illegal EXTVER value in input URL:");
          ffpmsg(extspec);
          *status = 0x7d;
          return 0x7d;
        }
        lVar6 = iVar10 + local_90 + (long)(int)sVar7;
        sVar7 = strspn(pcVar12 + lVar6," ,:");
        lVar6 = (int)sVar7 + lVar6;
        pcVar11 = pcVar12 + lVar6;
        sVar7 = strcspn(pcVar11,";");
        if ((int)sVar7 != 0) {
          uVar8 = (ulong)((byte)pcVar12[lVar6] - 0x41);
          if (0x33 < (byte)pcVar12[lVar6] - 0x41) {
LAB_00127e5f:
            pcVar12 = "unknown type of HDU in input URL:";
            goto LAB_00127e11;
          }
          if ((0x8000100080001U >> (uVar8 & 0x3f) & 1) == 0) {
            if ((0x200000002U >> (uVar8 & 0x3f) & 1) == 0) {
              if ((0x10000000100U >> (uVar8 & 0x3f) & 1) == 0) goto LAB_00127e5f;
              *local_88 = 0;
            }
            else {
              *local_88 = 2;
            }
          }
          else {
            *local_88 = 1;
          }
        }
      }
    }
    pcVar11 = strchr(pcVar11,0x3b);
    pcVar12 = pcVar11;
    if (pcVar11 == (char *)0x0) {
LAB_00127d76:
      return *status;
    }
    do {
      pcVar11 = pcVar11 + 1;
      pcVar9 = pcVar12 + 1;
      pcVar12 = pcVar12 + 1;
    } while (*pcVar9 == ' ');
    pcVar9 = strchr(pcVar12,0x28);
    if (pcVar9 == (char *)0x0) {
      ffpmsg("illegal specification of image in table cell in input URL:");
      pcVar12 = " did not find a row expression enclosed in ( )";
    }
    else {
      if (0x400 < (long)pcVar9 - (long)pcVar11) goto LAB_00127e20;
      strncat(local_80,pcVar12,(long)pcVar9 - (long)pcVar11);
      pcVar12 = pcVar9;
      do {
        pcVar9 = pcVar9 + 1;
        pcVar11 = pcVar12 + 1;
        pcVar12 = pcVar12 + 1;
      } while (*pcVar11 == ' ');
      pcVar11 = strchr(pcVar12,0x29);
      if (pcVar11 != (char *)0x0) {
        if ((long)pcVar11 - (long)pcVar9 < 0x401) {
          strncat(rowexpress,pcVar12,(long)pcVar11 - (long)pcVar9);
          goto LAB_00127d76;
        }
        goto LAB_00127e20;
      }
      ffpmsg("illegal specification of image in table cell in input URL:");
      pcVar12 = " missing closing \')\' character in row expression";
    }
  }
  else {
    piVar5 = __errno_location();
    *piVar5 = 0;
    lVar6 = strtol(pcVar12,&local_98,10);
    *extnum = (int)lVar6;
    for (; cVar1 = *local_98, cVar1 == ' '; local_98 = local_98 + 1) {
    }
    if (((cVar1 != '\0') && (cVar1 != ';')) || (bVar2 = false, *piVar5 == 0x22)) {
      *extnum = 0;
      *piVar5 = 0;
      bVar2 = true;
    }
    if ((uint)*extnum < 100000) goto LAB_00127b85;
    *extnum = 0;
    pcVar12 = "specified extension number is out of range:";
  }
LAB_00127e11:
  ffpmsg(pcVar12);
  ffpmsg(extspec);
LAB_00127e20:
  *status = 0x7d;
  return 0x7d;
}

Assistant:

int ffexts(char *extspec, 
                       int *extnum, 
                       char *extname,
                       int *extvers,
                       int *hdutype,
                       char *imagecolname,
                       char *rowexpress,
                       int *status)
{
/*
   Parse the input extension specification string, returning either the
   extension number or the values of the EXTNAME, EXTVERS, and XTENSION
   keywords in desired extension. Also return the name of the column containing
   an image, and an expression to be used to determine which row to use,
   if present.
*/
    char *ptr1, *ptr2;
    int slen, nvals;
    int notint = 1; /* initially assume specified extname is not an integer */
    char tmpname[FLEN_VALUE], *loc;

    *extnum = 0;
    *extname = '\0';
    *extvers = 0;
    *hdutype = ANY_HDU;
    *imagecolname = '\0';
    *rowexpress = '\0';

    if (*status > 0)
        return(*status);

    ptr1 = extspec;       /* pointer to first char */

    while (*ptr1 == ' ')  /* skip over any leading blanks */
        ptr1++;

    if (isdigit((int) *ptr1))  /* is the extension specification a number? */
    {
        notint = 0;  /* looks like extname may actually be the ext. number */
        errno = 0;  /* reset this prior to calling strtol */
        *extnum = strtol(ptr1, &loc, 10);  /* read the string as an integer */

        while (*loc == ' ')  /* skip over trailing blanks */
           loc++;

        /* check for read error, or junk following the integer */
        if ((*loc != '\0' && *loc != ';' ) || (errno == ERANGE) )
        {
           *extnum = 0;
           notint = 1;  /* no, extname was not a simple integer after all */
           errno = 0;  /* reset error condition flag if it was set */
        }

        if ( *extnum < 0 || *extnum > 99999)
        {
            *extnum = 0;   /* this is not a reasonable extension number */
            ffpmsg("specified extension number is out of range:");
            ffpmsg(extspec);
            return(*status = URL_PARSE_ERROR); 
        }
    }


/*  This logic was too simple, and failed on extnames like '1000TEMP' 
    where it would try to move to the 1000th extension

    if (isdigit((int) *ptr1))  
    {
        sscanf(ptr1, "%d", extnum);
        if (*extnum < 0 || *extnum > 9999)
        {
            *extnum = 0;   
            ffpmsg("specified extension number is out of range:");
            ffpmsg(extspec);
            return(*status = URL_PARSE_ERROR); 
        }
    }
*/

    if (notint)
    {
           /* not a number, so EXTNAME must be specified, followed by */
           /* optional EXTVERS and XTENSION  values */

           /* don't use space char as end indicator, because there */
           /* may be imbedded spaces in the EXTNAME value */
           slen = strcspn(ptr1, ",:;");   /* length of EXTNAME */

	   if (slen > FLEN_VALUE - 1)
	   {
                return(*status = URL_PARSE_ERROR); 
           }
 
           strncat(extname, ptr1, slen);  /* EXTNAME value */

           /* now remove any trailing blanks */
           while (slen > 0 && *(extname + slen -1) == ' ')
           {
               *(extname + slen -1) = '\0';
               slen--;
           }

           ptr1 += slen;
           slen = strspn(ptr1, " ,:");  /* skip delimiter characters */
           ptr1 += slen;

           slen = strcspn(ptr1, " ,:;");   /* length of EXTVERS */
           if (slen)
           {
               nvals = sscanf(ptr1, "%d", extvers);  /* EXTVERS value */
               if (nvals != 1)
               {
                   ffpmsg("illegal EXTVER value in input URL:");
                   ffpmsg(extspec);
                   return(*status = URL_PARSE_ERROR);
               }

               ptr1 += slen;
               slen = strspn(ptr1, " ,:");  /* skip delimiter characters */
               ptr1 += slen;

               slen = strcspn(ptr1, ";");   /* length of HDUTYPE */
               if (slen)
               {
                 if (*ptr1 == 'b' || *ptr1 == 'B')
                     *hdutype = BINARY_TBL;  
                 else if (*ptr1 == 't' || *ptr1 == 'T' ||
                          *ptr1 == 'a' || *ptr1 == 'A')
                     *hdutype = ASCII_TBL;
                 else if (*ptr1 == 'i' || *ptr1 == 'I')
                     *hdutype = IMAGE_HDU;
                 else
                 {
                     ffpmsg("unknown type of HDU in input URL:");
                     ffpmsg(extspec);
                     return(*status = URL_PARSE_ERROR);
                 }
               }
           }
           else
           {
                strcpy(tmpname, extname);
                ffupch(tmpname);
                if (!strcmp(tmpname, "PRIMARY") || !strcmp(tmpname, "P") )
                    *extname = '\0';  /* return extnum = 0 */
           }
    }

    ptr1 = strchr(ptr1, ';');
    if (ptr1)
    {
        /* an image is to be opened; the image is contained in a single */
        /* cell of a binary table.  A column name and an expression to  */
        /* determine which row to use has been entered.                 */

        ptr1++;  /* skip over the ';' delimiter */
        while (*ptr1 == ' ')  /* skip over any leading blanks */
            ptr1++;

        ptr2 = strchr(ptr1, '(');
        if (!ptr2)
        {
            ffpmsg("illegal specification of image in table cell in input URL:");
            ffpmsg(" did not find a row expression enclosed in ( )");
            ffpmsg(extspec);
            return(*status = URL_PARSE_ERROR);
        }

	if (ptr2 - ptr1 > FLEN_FILENAME - 1)
	{
            return(*status = URL_PARSE_ERROR); 
        }

        strncat(imagecolname, ptr1, ptr2 - ptr1); /* copy column name */

        ptr2++;  /* skip over the '(' delimiter */
        while (*ptr2 == ' ')  /* skip over any leading blanks */
            ptr2++;


        ptr1 = strchr(ptr2, ')');
        if (!ptr1)
        {
            ffpmsg("illegal specification of image in table cell in input URL:");
            ffpmsg(" missing closing ')' character in row expression");
            ffpmsg(extspec);
            return(*status = URL_PARSE_ERROR);
        }

	if (ptr1 - ptr2 > FLEN_FILENAME - 1)
        {
                return(*status = URL_PARSE_ERROR); 
        }
 
        strncat(rowexpress, ptr2, ptr1 - ptr2); /* row expression */
    }

    return(*status);
}